

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O2

void copy_recurse_data(compiler_common *common,PCRE2_SPTR16 cc,PCRE2_SPTR16 ccend,int type,
                      int stackptr,int stacktop,BOOL has_quit)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  sljit_compiler *compiler;
  int iVar6;
  int iVar7;
  int *piVar8;
  long lVar9;
  sljit_sw sVar10;
  long lVar11;
  uint load_base;
  compiler_common *cc_00;
  uint uVar12;
  sljit_sw store_offset;
  int *piVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  compiler_common *local_128;
  ulong local_120;
  uint local_118;
  sljit_sw private_srcw [2];
  sljit_sw shared_srcw [3];
  sljit_sw kept_shared_srcw [2];
  delayed_mem_copy_status local_80;
  ulong local_40;
  compiler_common *local_38;
  
  local_38 = (compiler_common *)ccend;
  piVar8 = local_80.saved_tmp_regs + 1;
  load_base = 0xc;
  iVar6 = 4;
  piVar13 = local_80.tmp_regs + 1;
  if (type - 1U < 3) {
LAB_0014671c:
    bVar16 = false;
  }
  else {
    bVar16 = true;
    if (type != 0) {
      piVar13 = local_80.saved_tmp_regs + 1;
      load_base = 4;
      iVar6 = 5;
      piVar8 = local_80.tmp_regs + 1;
      goto LAB_0014671c;
    }
  }
  cc_00 = (compiler_common *)0x1;
  local_80.tmp_regs[0] = 1;
  local_80.saved_tmp_regs[0] = 1;
  *piVar13 = iVar6;
  *piVar8 = iVar6;
  local_80.saved_tmp_regs[2] = 3;
  local_80.tmp_regs[2] = 3;
  for (lVar9 = 2; lVar9 != 5; lVar9 = lVar9 + 1) {
    local_80.store_bases[lVar9 + -2] = -1;
  }
  uVar12 = stackptr * 8;
  local_80.next_tmp_reg = 0;
  local_80.compiler = common->compiler;
  if (type - 4U < 0xfffffffe) {
    if (!bVar16) {
      cc_00 = (compiler_common *)(ulong)load_base;
      delayed_mem_copy_move(&local_80,load_base,(ulong)uVar12,0xe,(long)common->recursive_head_ptr);
      if (type != 4) goto LAB_001467de;
    }
    cc_00 = (compiler_common *)&DAT_0000000e;
    delayed_mem_copy_move(&local_80,0xe,(long)common->recursive_head_ptr,load_base,(ulong)uVar12);
  }
LAB_001467de:
  uVar15 = (ulong)(uVar12 + 8);
  bVar5 = false;
  bVar2 = false;
  bVar4 = false;
  bVar3 = false;
  do {
    compiler = local_80.compiler;
    if (local_38 <= cc) {
      iVar7 = 3;
      iVar6 = local_80.next_tmp_reg;
      while (bVar16 = iVar7 != 0, iVar7 = iVar7 + -1, bVar16) {
        if (local_80.store_bases[iVar6] != 0xffffffff) {
          sljit_emit_op1(compiler,0x20,local_80.store_bases[iVar6] | 0x80,
                         (long)local_80.store_offsets[iVar6],local_80.tmp_regs[iVar6],0);
        }
        iVar6 = (iVar6 + 1) % 3;
      }
      return;
    }
    switch(*(short *)&((compiler_common *)cc)->compiler) {
    case 3:
      uVar12 = 0;
      bVar17 = !bVar5 && stacktop != 0;
      if (bVar17) {
        kept_shared_srcw[0] = (long)common->ovector_start;
        bVar5 = true;
      }
      local_120._0_4_ = (uint)bVar17;
      local_128 = (compiler_common *)((long)&((compiler_common *)cc)->compiler + 2);
      local_118 = 0;
      goto LAB_00146c07;
    default:
      local_128 = (compiler_common *)next_opcode((compiler_common *)cc,(PCRE2_SPTR16)cc_00);
      uVar12 = 0;
      break;
    case 0x21:
    case 0x23:
    case 0x2e:
    case 0x30:
    case 0x3b:
    case 0x3d:
    case 0x48:
    case 0x4a:
    case 0x5b:
    case 0x5c:
      lVar9 = (long)*(int *)((long)common->private_data_ptrs + ((long)cc - (long)common->start) * 2)
      ;
      uVar12 = 0;
      if (lVar9 != 0) {
        private_srcw[0] = lVar9;
        private_srcw[1] = lVar9 + 8;
        uVar12 = 2;
      }
      goto LAB_001468bd;
    case 0x22:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x2f:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x3c:
    case 0x3e:
    case 0x3f:
    case 0x40:
    case 0x49:
    case 0x4b:
    case 0x4c:
    case 0x4d:
      lVar9 = (long)*(int *)((long)common->private_data_ptrs + ((long)cc - (long)common->start) * 2)
      ;
      uVar12 = 0;
      if (lVar9 != 0) {
        private_srcw[0] = lVar9;
        uVar12 = 1;
      }
LAB_001468bd:
      local_128 = (compiler_common *)((long)&((compiler_common *)cc)->compiler + 4);
      break;
    case 0x27:
    case 0x28:
    case 0x34:
    case 0x35:
    case 0x41:
    case 0x42:
    case 0x4e:
    case 0x4f:
      lVar9 = (long)*(int *)((long)common->private_data_ptrs + ((long)cc - (long)common->start) * 2)
      ;
      uVar12 = 0;
      if (lVar9 != 0) {
        private_srcw[0] = lVar9;
        private_srcw[1] = lVar9 + 8;
        uVar12 = 2;
      }
      local_128 = (compiler_common *)((long)&((compiler_common *)cc)->compiler + 6);
      break;
    case 0x55:
    case 0x57:
      lVar9 = (long)*(int *)((long)common->private_data_ptrs + ((long)cc - (long)common->start) * 2)
      ;
      uVar12 = 0;
      if (lVar9 != 0) {
        private_srcw[0] = lVar9;
        private_srcw[1] = lVar9 + 8;
        uVar12 = 2;
      }
      goto LAB_00146bf9;
    case 0x56:
    case 0x58:
    case 0x59:
    case 0x5a:
      lVar9 = (long)*(int *)((long)common->private_data_ptrs + ((long)cc - (long)common->start) * 2)
      ;
      uVar12 = 0;
      if (lVar9 != 0) {
        private_srcw[0] = lVar9;
        uVar12 = 1;
      }
LAB_00146bf9:
      local_128 = (compiler_common *)((long)&((compiler_common *)cc)->compiler + 2);
      break;
    case 0x6e:
    case 0x6f:
    case 0x70:
      uVar14 = 0x11;
      if (*(short *)&((compiler_common *)cc)->compiler == 0x70) {
        uVar14 = (ulong)*(ushort *)((long)&((compiler_common *)cc)->compiler + 2);
      }
      lVar9 = (long)*(int *)((long)common->private_data_ptrs + ((long)cc - (long)common->start) * 2)
      ;
      local_118 = 0;
      uVar12 = 0;
      if (lVar9 != 0) {
        iVar6 = get_class_iterator_size
                          ((PCRE2_SPTR16)((long)&((compiler_common *)cc)->compiler + uVar14 * 2));
        if (iVar6 == 2) {
          private_srcw[0] = lVar9;
          private_srcw[1] = lVar9 + 8;
          uVar12 = 2;
        }
        else {
          uVar12 = 0;
          if (iVar6 == 1) {
            private_srcw[0] = lVar9;
            uVar12 = 1;
          }
        }
      }
      local_128 = (compiler_common *)((long)&((compiler_common *)cc)->compiler + uVar14 * 2);
      local_120._0_4_ = 0;
      goto LAB_00146c07;
    case 0x75:
      if (stacktop == 0) {
        local_120 = 0;
      }
      else {
        bVar17 = !bVar5 && common->has_set_som != 0;
        if (bVar17) {
          kept_shared_srcw[0] = (long)common->ovector_start;
          bVar5 = true;
        }
        local_120 = (ulong)bVar17;
        if (!bVar2 && (long)common->mark_ptr != 0) {
          kept_shared_srcw[local_120] = (long)common->mark_ptr;
          local_120 = (ulong)(bVar17 + 1);
          bVar2 = true;
        }
      }
      bVar17 = !bVar4 && (long)common->capture_last_ptr != 0;
      if (bVar17) {
        shared_srcw[0] = (long)common->capture_last_ptr;
        bVar4 = true;
      }
      local_128 = (compiler_common *)((long)&((compiler_common *)cc)->compiler + 4);
      goto LAB_001469c1;
    case 0x79:
      lVar9 = (long)cc - (long)common->start;
      lVar11 = (long)*(int *)((long)common->private_data_ptrs + lVar9 * 2);
      if (lVar11 != 0) {
        private_srcw[0] = lVar11;
        cc = (PCRE2_SPTR16)
             ((long)&((compiler_common *)cc)->compiler +
             (long)*(int *)((long)common->private_data_ptrs + lVar9 * 2 + 4) * 2);
      }
      uVar12 = (uint)(lVar11 != 0);
      local_128 = (compiler_common *)((long)&((compiler_common *)cc)->compiler + 4);
      break;
    case 0x7e:
    case 0x7f:
    case 0x80:
    case 0x81:
    case 0x82:
    case 0x84:
    case 0x88:
    case 0x89:
    case 0x8c:
      private_srcw[0] =
           (long)*(int *)((long)common->private_data_ptrs + ((long)cc - (long)common->start) * 2);
      local_128 = (compiler_common *)((long)&((compiler_common *)cc)->compiler + 4);
      uVar12 = 1;
      break;
    case 0x85:
    case 0x8a:
      uVar1 = *(ushort *)((long)&((compiler_common *)cc)->compiler + 4);
      shared_srcw[0] = (ulong)uVar1 * 0x10 + (long)common->ovector_start;
      shared_srcw[1] = (ulong)uVar1 * 0x10 + (long)common->ovector_start + 8;
      lVar9 = (long)common->capture_last_ptr;
      cc_00 = (compiler_common *)CONCAT71((int7)((ulong)shared_srcw[0] >> 8),bVar4 || lVar9 == 0);
      local_118 = 2;
      if (!bVar4 && lVar9 != 0) {
        shared_srcw[2] = lVar9;
        local_118 = 3;
        bVar4 = true;
      }
      local_120._0_4_ = 0;
      bVar17 = common->optimized_cbracket[uVar1] == '\0';
      if (bVar17) {
        private_srcw[0] = (long)common->cbra_ptr + (ulong)uVar1 * 8;
      }
      uVar12 = (uint)bVar17;
      local_128 = (compiler_common *)((long)&((compiler_common *)cc)->compiler + 6);
      goto LAB_00146c07;
    case 0x86:
    case 0x8b:
      uVar1 = *(ushort *)((long)&((compiler_common *)cc)->compiler + 4);
      lVar9 = (ulong)uVar1 * 0x10;
      shared_srcw[0] = lVar9 + common->ovector_start;
      shared_srcw[1] = lVar9 + common->ovector_start + 8;
      local_118 = 2;
      if (!bVar4 && (long)common->capture_last_ptr != 0) {
        shared_srcw[2] = (long)common->capture_last_ptr;
        local_118 = 3;
        bVar4 = true;
      }
      private_srcw[0] =
           (long)*(int *)((long)common->private_data_ptrs + ((long)cc - (long)common->start) * 2);
      private_srcw[1] = (long)common->cbra_ptr + (ulong)uVar1 * 8;
      local_128 = (compiler_common *)((long)&((compiler_common *)cc)->compiler + 6);
      local_120._0_4_ = 0;
      uVar12 = 2;
      cc_00 = common;
      goto LAB_00146c07;
    case 0x87:
      bVar17 = (*(ushort *)
                 ((long)&((compiler_common *)cc)->compiler +
                 (ulong)*(ushort *)((long)&((compiler_common *)cc)->compiler + 2) * 2) & 0xfffe) ==
               0x7a;
      if (bVar17) {
        private_srcw[0] =
             (long)*(int *)((long)common->private_data_ptrs + ((long)cc - (long)common->start) * 2);
      }
      uVar12 = (uint)bVar17;
      local_128 = (compiler_common *)((long)&((compiler_common *)cc)->compiler + 4);
      break;
    case 0x96:
    case 0x98:
    case 0x9c:
    case 0x9e:
      bVar17 = !bVar2 && stacktop != 0;
      if (bVar17) {
        kept_shared_srcw[0] = (long)common->mark_ptr;
        bVar2 = true;
      }
      local_120._0_4_ = (uint)bVar17;
      bVar17 = !bVar3 && (long)common->control_head_ptr != 0;
      if (bVar17) {
        shared_srcw[0] = (long)common->control_head_ptr;
        bVar3 = true;
      }
      local_128 = (compiler_common *)
                  ((long)&((compiler_common *)cc)->compiler +
                  (ulong)*(ushort *)((long)&((compiler_common *)cc)->compiler + 2) * 2 + 6);
LAB_001469c1:
      local_118 = (uint)bVar17;
      uVar12 = 0;
      goto LAB_00146c07;
    case 0x9b:
      uVar12 = 0;
      if (!bVar3) {
        shared_srcw[0] = (long)common->control_head_ptr;
      }
      local_118 = (uint)!bVar3;
      local_128 = (compiler_common *)((long)&((compiler_common *)cc)->compiler + 2);
      local_120._0_4_ = 0;
      bVar3 = true;
      goto LAB_00146c07;
    }
    local_118 = 0;
    local_120._0_4_ = 0;
LAB_00146c07:
    if (type - 4U < 0xfffffffe) {
      local_40 = uVar15;
      for (uVar14 = 0; uVar12 << 3 != uVar14; uVar14 = uVar14 + 8) {
        iVar6 = (int)uVar15 + (int)uVar14;
        if (bVar16) {
          sVar10 = *(sljit_sw *)((long)private_srcw + uVar14);
LAB_00146c61:
          cc_00 = (compiler_common *)&DAT_0000000e;
          delayed_mem_copy_move(&local_80,0xe,sVar10,load_base,(long)iVar6);
        }
        else {
          sVar10 = *(sljit_sw *)((long)private_srcw + uVar14);
          cc_00 = (compiler_common *)(ulong)load_base;
          delayed_mem_copy_move(&local_80,load_base,(long)iVar6,0xe,sVar10);
          if (type == 4) goto LAB_00146c61;
        }
      }
      iVar6 = (int)local_40 + (int)uVar14;
    }
    else {
      iVar6 = (int)uVar15 + uVar12 * 8;
    }
    if ((type | 2U) == 3) {
      iVar7 = local_118 * 8;
    }
    else {
      for (uVar15 = 0; iVar7 = (int)uVar15, local_118 << 3 != uVar15; uVar15 = uVar15 + 8) {
        if (bVar16) {
          sVar10 = *(sljit_sw *)((long)shared_srcw + uVar15);
LAB_00146d0e:
          cc_00 = (compiler_common *)&DAT_0000000e;
          delayed_mem_copy_move(&local_80,0xe,sVar10,load_base,(long)(iVar6 + iVar7));
        }
        else {
          sVar10 = *(sljit_sw *)((long)shared_srcw + uVar15);
          cc_00 = (compiler_common *)(ulong)load_base;
          delayed_mem_copy_move(&local_80,load_base,(long)(iVar6 + iVar7),0xe,sVar10);
          if (type == 4) goto LAB_00146d0e;
        }
      }
    }
    iVar6 = iVar6 + iVar7;
    cc = (PCRE2_SPTR16)local_128;
    if ((type == 1) || (type == 4)) {
      uVar15 = (ulong)(iVar6 + (uint)local_120 * 8);
    }
    else {
      for (uVar15 = 0; (uint)local_120 << 3 != uVar15; uVar15 = uVar15 + 8) {
        iVar7 = iVar6 + (int)uVar15;
        if (bVar16) {
          sVar10 = *(sljit_sw *)((long)kept_shared_srcw + uVar15);
          store_offset = (sljit_sw)iVar7;
          cc_00 = (compiler_common *)&DAT_0000000e;
          uVar12 = load_base;
        }
        else {
          sVar10 = (sljit_sw)iVar7;
          store_offset = *(sljit_sw *)((long)kept_shared_srcw + uVar15);
          cc_00 = (compiler_common *)(ulong)load_base;
          uVar12 = 0xe;
        }
        delayed_mem_copy_move(&local_80,(int)cc_00,sVar10,uVar12,store_offset);
      }
      uVar15 = (ulong)(uint)(iVar6 + (int)uVar15);
    }
  } while( true );
}

Assistant:

static void copy_recurse_data(compiler_common *common, PCRE2_SPTR cc, PCRE2_SPTR ccend,
  int type, int stackptr, int stacktop, BOOL has_quit)
{
delayed_mem_copy_status status;
PCRE2_SPTR alternative;
sljit_sw private_srcw[2];
sljit_sw shared_srcw[3];
sljit_sw kept_shared_srcw[2];
int private_count, shared_count, kept_shared_count;
int from_sp, base_reg, offset, i;
BOOL setsom_found = FALSE;
BOOL setmark_found = FALSE;
BOOL capture_last_found = FALSE;
BOOL control_head_found = FALSE;

#if defined DEBUG_FORCE_CONTROL_HEAD && DEBUG_FORCE_CONTROL_HEAD
SLJIT_ASSERT(common->control_head_ptr != 0);
control_head_found = TRUE;
#endif

switch (type)
  {
  case recurse_copy_from_global:
  from_sp = TRUE;
  base_reg = STACK_TOP;
  break;

  case recurse_copy_private_to_global:
  case recurse_copy_shared_to_global:
  case recurse_copy_kept_shared_to_global:
  from_sp = FALSE;
  base_reg = STACK_TOP;
  break;

  default:
  SLJIT_ASSERT(type == recurse_swap_global);
  from_sp = FALSE;
  base_reg = TMP2;
  break;
  }

stackptr = STACK(stackptr);
stacktop = STACK(stacktop);

status.tmp_regs[0] = TMP1;
status.saved_tmp_regs[0] = TMP1;

if (base_reg != TMP2)
  {
  status.tmp_regs[1] = TMP2;
  status.saved_tmp_regs[1] = TMP2;
  }
else
  {
  status.saved_tmp_regs[1] = RETURN_ADDR;
  if (sljit_get_register_index (RETURN_ADDR) == -1)
    status.tmp_regs[1] = STR_PTR;
  else
    status.tmp_regs[1] = RETURN_ADDR;
  }

status.saved_tmp_regs[2] = TMP3;
if (sljit_get_register_index (TMP3) == -1)
  status.tmp_regs[2] = STR_END;
else
  status.tmp_regs[2] = TMP3;

delayed_mem_copy_init(&status, common);

if (type != recurse_copy_shared_to_global && type != recurse_copy_kept_shared_to_global)
  {
  SLJIT_ASSERT(type == recurse_copy_from_global || type == recurse_copy_private_to_global || type == recurse_swap_global);

  if (!from_sp)
    delayed_mem_copy_move(&status, base_reg, stackptr, SLJIT_SP, common->recursive_head_ptr);

  if (from_sp || type == recurse_swap_global)
    delayed_mem_copy_move(&status, SLJIT_SP, common->recursive_head_ptr, base_reg, stackptr);
  }

stackptr += sizeof(sljit_sw);

#if defined DEBUG_FORCE_CONTROL_HEAD && DEBUG_FORCE_CONTROL_HEAD
if (type != recurse_copy_shared_to_global)
  {
  if (!from_sp)
    delayed_mem_copy_move(&status, base_reg, stackptr, SLJIT_SP, common->control_head_ptr);

  if (from_sp || type == recurse_swap_global)
    delayed_mem_copy_move(&status, SLJIT_SP, common->control_head_ptr, base_reg, stackptr);
  }

stackptr += sizeof(sljit_sw);
#endif

while (cc < ccend)
  {
  private_count = 0;
  shared_count = 0;
  kept_shared_count = 0;

  switch(*cc)
    {
    case OP_SET_SOM:
    SLJIT_ASSERT(common->has_set_som);
    if (has_quit && !setsom_found)
      {
      kept_shared_srcw[0] = OVECTOR(0);
      kept_shared_count = 1;
      setsom_found = TRUE;
      }
    cc += 1;
    break;

    case OP_RECURSE:
    if (has_quit)
      {
      if (common->has_set_som && !setsom_found)
        {
        kept_shared_srcw[0] = OVECTOR(0);
        kept_shared_count = 1;
        setsom_found = TRUE;
        }
      if (common->mark_ptr != 0 && !setmark_found)
        {
        kept_shared_srcw[kept_shared_count] = common->mark_ptr;
        kept_shared_count++;
        setmark_found = TRUE;
        }
      }
    if (common->capture_last_ptr != 0 && !capture_last_found)
      {
      shared_srcw[0] = common->capture_last_ptr;
      shared_count = 1;
      capture_last_found = TRUE;
      }
    cc += 1 + LINK_SIZE;
    break;

    case OP_KET:
    if (PRIVATE_DATA(cc) != 0)
      {
      private_count = 1;
      private_srcw[0] = PRIVATE_DATA(cc);
      SLJIT_ASSERT(PRIVATE_DATA(cc + 1) != 0);
      cc += PRIVATE_DATA(cc + 1);
      }
    cc += 1 + LINK_SIZE;
    break;

    case OP_ASSERT:
    case OP_ASSERT_NOT:
    case OP_ASSERTBACK:
    case OP_ASSERTBACK_NOT:
    case OP_ONCE:
    case OP_BRAPOS:
    case OP_SBRA:
    case OP_SBRAPOS:
    case OP_SCOND:
    private_count = 1;
    private_srcw[0] = PRIVATE_DATA(cc);
    cc += 1 + LINK_SIZE;
    break;

    case OP_CBRA:
    case OP_SCBRA:
    offset = (GET2(cc, 1 + LINK_SIZE)) << 1;
    shared_srcw[0] = OVECTOR(offset);
    shared_srcw[1] = OVECTOR(offset + 1);
    shared_count = 2;

    if (common->capture_last_ptr != 0 && !capture_last_found)
      {
      shared_srcw[2] = common->capture_last_ptr;
      shared_count = 3;
      capture_last_found = TRUE;
      }

    if (common->optimized_cbracket[GET2(cc, 1 + LINK_SIZE)] == 0)
      {
      private_count = 1;
      private_srcw[0] = OVECTOR_PRIV(GET2(cc, 1 + LINK_SIZE));
      }
    cc += 1 + LINK_SIZE + IMM2_SIZE;
    break;

    case OP_CBRAPOS:
    case OP_SCBRAPOS:
    offset = (GET2(cc, 1 + LINK_SIZE)) << 1;
    shared_srcw[0] = OVECTOR(offset);
    shared_srcw[1] = OVECTOR(offset + 1);
    shared_count = 2;

    if (common->capture_last_ptr != 0 && !capture_last_found)
      {
      shared_srcw[2] = common->capture_last_ptr;
      shared_count = 3;
      capture_last_found = TRUE;
      }

    private_count = 2;
    private_srcw[0] = PRIVATE_DATA(cc);
    private_srcw[1] = OVECTOR_PRIV(GET2(cc, 1 + LINK_SIZE));
    cc += 1 + LINK_SIZE + IMM2_SIZE;
    break;

    case OP_COND:
    /* Might be a hidden SCOND. */
    alternative = cc + GET(cc, 1);
    if (*alternative == OP_KETRMAX || *alternative == OP_KETRMIN)
      {
      private_count = 1;
      private_srcw[0] = PRIVATE_DATA(cc);
      }
    cc += 1 + LINK_SIZE;
    break;

    CASE_ITERATOR_PRIVATE_DATA_1
    if (PRIVATE_DATA(cc))
      {
      private_count = 1;
      private_srcw[0] = PRIVATE_DATA(cc);
      }
    cc += 2;
#ifdef SUPPORT_UNICODE
    if (common->utf && HAS_EXTRALEN(cc[-1])) cc += GET_EXTRALEN(cc[-1]);
#endif
    break;

    CASE_ITERATOR_PRIVATE_DATA_2A
    if (PRIVATE_DATA(cc))
      {
      private_count = 2;
      private_srcw[0] = PRIVATE_DATA(cc);
      private_srcw[1] = PRIVATE_DATA(cc) + sizeof(sljit_sw);
      }
    cc += 2;
#ifdef SUPPORT_UNICODE
    if (common->utf && HAS_EXTRALEN(cc[-1])) cc += GET_EXTRALEN(cc[-1]);
#endif
    break;

    CASE_ITERATOR_PRIVATE_DATA_2B
    if (PRIVATE_DATA(cc))
      {
      private_count = 2;
      private_srcw[0] = PRIVATE_DATA(cc);
      private_srcw[1] = PRIVATE_DATA(cc) + sizeof(sljit_sw);
      }
    cc += 2 + IMM2_SIZE;
#ifdef SUPPORT_UNICODE
    if (common->utf && HAS_EXTRALEN(cc[-1])) cc += GET_EXTRALEN(cc[-1]);
#endif
    break;

    CASE_ITERATOR_TYPE_PRIVATE_DATA_1
    if (PRIVATE_DATA(cc))
      {
      private_count = 1;
      private_srcw[0] = PRIVATE_DATA(cc);
      }
    cc += 1;
    break;

    CASE_ITERATOR_TYPE_PRIVATE_DATA_2A
    if (PRIVATE_DATA(cc))
      {
      private_count = 2;
      private_srcw[0] = PRIVATE_DATA(cc);
      private_srcw[1] = private_srcw[0] + sizeof(sljit_sw);
      }
    cc += 1;
    break;

    CASE_ITERATOR_TYPE_PRIVATE_DATA_2B
    if (PRIVATE_DATA(cc))
      {
      private_count = 2;
      private_srcw[0] = PRIVATE_DATA(cc);
      private_srcw[1] = private_srcw[0] + sizeof(sljit_sw);
      }
    cc += 1 + IMM2_SIZE;
    break;

    case OP_CLASS:
    case OP_NCLASS:
#if defined SUPPORT_UNICODE || PCRE2_CODE_UNIT_WIDTH != 8
    case OP_XCLASS:
    i = (*cc == OP_XCLASS) ? GET(cc, 1) : 1 + 32 / (int)sizeof(PCRE2_UCHAR);
#else
    i = 1 + 32 / (int)sizeof(PCRE2_UCHAR);
#endif
    if (PRIVATE_DATA(cc) != 0)
      switch(get_class_iterator_size(cc + i))
        {
        case 1:
        private_count = 1;
        private_srcw[0] = PRIVATE_DATA(cc);
        break;

        case 2:
        private_count = 2;
        private_srcw[0] = PRIVATE_DATA(cc);
        private_srcw[1] = private_srcw[0] + sizeof(sljit_sw);
        break;

        default:
        SLJIT_UNREACHABLE();
        break;
        }
    cc += i;
    break;

    case OP_MARK:
    case OP_COMMIT_ARG:
    case OP_PRUNE_ARG:
    case OP_THEN_ARG:
    SLJIT_ASSERT(common->mark_ptr != 0);
    if (has_quit && !setmark_found)
      {
      kept_shared_srcw[0] = common->mark_ptr;
      kept_shared_count = 1;
      setmark_found = TRUE;
      }
    if (common->control_head_ptr != 0 && !control_head_found)
      {
      shared_srcw[0] = common->control_head_ptr;
      shared_count = 1;
      control_head_found = TRUE;
      }
    cc += 1 + 2 + cc[1];
    break;

    case OP_THEN:
    SLJIT_ASSERT(common->control_head_ptr != 0);
    if (!control_head_found)
      {
      shared_srcw[0] = common->control_head_ptr;
      shared_count = 1;
      control_head_found = TRUE;
      }
    cc++;
    break;

    default:
    cc = next_opcode(common, cc);
    SLJIT_ASSERT(cc != NULL);
    break;
    }

  if (type != recurse_copy_shared_to_global && type != recurse_copy_kept_shared_to_global)
    {
    SLJIT_ASSERT(type == recurse_copy_from_global || type == recurse_copy_private_to_global || type == recurse_swap_global);

    for (i = 0; i < private_count; i++)
      {
      SLJIT_ASSERT(private_srcw[i] != 0);

      if (!from_sp)
        delayed_mem_copy_move(&status, base_reg, stackptr, SLJIT_SP, private_srcw[i]);

      if (from_sp || type == recurse_swap_global)
        delayed_mem_copy_move(&status, SLJIT_SP, private_srcw[i], base_reg, stackptr);

      stackptr += sizeof(sljit_sw);
      }
    }
  else
    stackptr += sizeof(sljit_sw) * private_count;

  if (type != recurse_copy_private_to_global && type != recurse_copy_kept_shared_to_global)
    {
    SLJIT_ASSERT(type == recurse_copy_from_global || type == recurse_copy_shared_to_global || type == recurse_swap_global);

    for (i = 0; i < shared_count; i++)
      {
      SLJIT_ASSERT(shared_srcw[i] != 0);

      if (!from_sp)
        delayed_mem_copy_move(&status, base_reg, stackptr, SLJIT_SP, shared_srcw[i]);

      if (from_sp || type == recurse_swap_global)
        delayed_mem_copy_move(&status, SLJIT_SP, shared_srcw[i], base_reg, stackptr);

      stackptr += sizeof(sljit_sw);
      }
    }
  else
    stackptr += sizeof(sljit_sw) * shared_count;

  if (type != recurse_copy_private_to_global && type != recurse_swap_global)
    {
    SLJIT_ASSERT(type == recurse_copy_from_global || type == recurse_copy_shared_to_global || type == recurse_copy_kept_shared_to_global);

    for (i = 0; i < kept_shared_count; i++)
      {
      SLJIT_ASSERT(kept_shared_srcw[i] != 0);

      if (!from_sp)
        delayed_mem_copy_move(&status, base_reg, stackptr, SLJIT_SP, kept_shared_srcw[i]);

      if (from_sp || type == recurse_swap_global)
        delayed_mem_copy_move(&status, SLJIT_SP, kept_shared_srcw[i], base_reg, stackptr);

      stackptr += sizeof(sljit_sw);
      }
    }
  else
    stackptr += sizeof(sljit_sw) * kept_shared_count;
  }